

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  bool bVar3;
  pointer ppLVar1;
  Layer *pLVar2;
  undefined3 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  ModelBinFromDataReader mb;
  Option opt1;
  
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fwrite("network graph not ready",0x17,1,_stderr);
    fputc(10,_stderr);
    iVar6 = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&mb,dr);
    iVar6 = 0;
    pcVar8 = "load_model error at layer %d, parameter file has inconsistent content.";
    for (uVar7 = 0;
        ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->layers).
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3);
        uVar7 = uVar7 + 1) {
      pLVar2 = ppLVar1[uVar7];
      if (pLVar2 == (Layer *)0x0) {
LAB_0012eab7:
        fprintf(_stderr,pcVar8,uVar7 & 0xffffffff);
        fputc(10,_stderr);
        iVar6 = -1;
        break;
      }
      iVar5 = (*pLVar2->_vptr_Layer[3])(pLVar2,&mb);
      if (iVar5 != 0) {
        pcVar8 = "layer load_model %d failed";
        goto LAB_0012eab7;
      }
    }
    for (uVar7 = 0;
        ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->layers).
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3);
        uVar7 = uVar7 + 1) {
      pLVar2 = ppLVar1[uVar7];
      if (pLVar2 == (Layer *)0x0) {
        pcVar8 = "load_model error at layer %d, parameter file has inconsistent content.";
LAB_0012eb7e:
        fprintf(_stderr,pcVar8,uVar7 & 0xffffffff);
        fputc(10,_stderr);
        iVar6 = -1;
        break;
      }
      opt1.use_int8_arithmetic = (this->opt).use_int8_arithmetic;
      opt1.use_packing_layout = (this->opt).use_packing_layout;
      opt1.use_shader_pack8 = (this->opt).use_shader_pack8;
      opt1.use_image_storage = (this->opt).use_image_storage;
      bVar3 = (this->opt).use_bf16_storage;
      uVar4 = *(undefined3 *)&(this->opt).field_0x25;
      opt1._36_4_ = CONCAT31(uVar4,bVar3);
      opt1.lightmode = (this->opt).lightmode;
      opt1._1_3_ = *(undefined3 *)&(this->opt).field_0x1;
      opt1.num_threads = (this->opt).num_threads;
      opt1.blob_allocator._0_4_ = *(undefined4 *)&(this->opt).blob_allocator;
      opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
      opt1.workspace_allocator._0_4_ = *(undefined4 *)&(this->opt).workspace_allocator;
      opt1.workspace_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
      opt1.use_winograd_convolution = (this->opt).use_winograd_convolution;
      opt1.use_sgemm_convolution = (this->opt).use_sgemm_convolution;
      opt1.use_int8_inference = (this->opt).use_int8_inference;
      opt1.use_vulkan_compute = (this->opt).use_vulkan_compute;
      opt1.use_fp16_packed = (this->opt).use_fp16_packed;
      opt1.use_fp16_storage = (this->opt).use_fp16_storage;
      opt1.use_fp16_arithmetic = (this->opt).use_fp16_arithmetic;
      opt1.use_int8_storage = (this->opt).use_int8_storage;
      if (pLVar2->support_image_storage == false) {
        opt1.use_image_storage = false;
      }
      iVar5 = (*pLVar2->_vptr_Layer[4])(pLVar2,&opt1);
      if (iVar5 != 0) {
        pcVar8 = "layer create_pipeline %d failed";
        goto LAB_0012eb7e;
      }
    }
    ModelBin::~ModelBin(&mb.super_ModelBin);
  }
  return iVar6;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}